

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::objectivec::EnumValueShortName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,EnumValueDescriptor *descriptor)

{
  int iVar1;
  EnumValueDescriptor *descriptor_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_80;
  string *local_78;
  long local_70 [2];
  string local_60;
  string local_40;
  
  EnumName_abi_cxx11_(&local_40,*(objectivec **)(this + 0x18),(EnumDescriptor *)descriptor);
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,local_40._M_dataplus._M_p,
             local_40._M_dataplus._M_p + local_40._M_string_length);
  std::__cxx11::string::append((char *)&local_80);
  EnumValueName_abi_cxx11_(&local_60,this,descriptor_00);
  if ((local_60._M_string_length < local_78) ||
     (iVar1 = std::__cxx11::string::compare((ulong)&local_60,0,local_78), iVar1 != 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_60._M_dataplus._M_p,
               (string *)(local_60._M_string_length + (long)local_60._M_dataplus._M_p));
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string EnumValueShortName(const EnumValueDescriptor* descriptor) {
  // Enum value names (EnumValueName above) are the enum name turned into
  // a class name and then the value name is CamelCased and concatenated; the
  // whole thing then gets sanitized for reserved words.
  // The "short name" is intended to be the final leaf, the value name; but
  // you can't simply send that off to sanitize as that could result in it
  // getting modified when the full name didn't.  For example enum
  // "StorageModes" has a value "retain".  So the full name is
  // "StorageModes_Retain", but if we sanitize "retain" it would become
  // "RetainValue".
  // So the right way to get the short name is to take the full enum name
  // and then strip off the enum name (leaving the value name and anything
  // done by sanitize).
  const string& class_name = EnumName(descriptor->type());
  const string& long_name_prefix = class_name + "_";
  const string& long_name = EnumValueName(descriptor);
  return StripPrefixString(long_name, long_name_prefix);
}